

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createInstructionTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  DefaultDeleter<tcu::TestCaseGroup> local_89;
  undefined1 local_88 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsAndroidTests;
  undefined1 local_70 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> computeAndroidTests;
  undefined1 local_58 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> graphicsTests;
  undefined1 local_40 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> computeTests;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> instructionTests;
  TestContext *testCtx_local;
  
  instructionTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    instructionTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"instruction","Instructions with special opcodes/operands");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &computeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    instructionTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"compute","Compute Instructions with special opcodes/operands");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &graphicsTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40,pTVar1
            );
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    instructionTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"graphics","Graphics Instructions with special opcodes/operands");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &computeAndroidTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58,pTVar1
            );
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpNopGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpFUnordGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpAtomicGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpLineGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpNoLineGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpConstantNullGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpConstantCompositeGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpConstantUsageGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createSpecConstantGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSourceGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSourceExtensionGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createDecorationGroupGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpPhiGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createLoopControlGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createFunctionControlGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createSelectionControlGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createBlockOrderGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createMultipleShaderGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createMemoryAccessGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpCopyMemoryGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpCopyObjectGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createNoContractionGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpUndefGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpUnreachableGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpQuantizeToF16Group
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpFRemGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSRemComputeGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSRemComputeGroup64
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSModComputeGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSModComputeGroup64
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &createSConvertTests((TestContext *)
                                instructionTests.
                                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &createUConvertTests((TestContext *)
                                instructionTests.
                                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &createOpCompositeInsertGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &createOpInBoundsAccessChainGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &createShaderDefaultOutputGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    instructionTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"android","Android CTS Tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &graphicsAndroidTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70,pTVar1
            );
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_70)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSRemComputeGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_QUALITY_WARNING)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_70)->super_TestNode;
  pTVar3 = &anon_unknown_5::createOpSModComputeGroup
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_QUALITY_WARNING)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_40)->super_TestNode;
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpNopTests((TestContext *)
                             instructionTests.
                             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpSourceTests((TestContext *)
                                instructionTests.
                                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpSourceContinuedTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpLineTests((TestContext *)
                              instructionTests.
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpNoLineTests((TestContext *)
                                instructionTests.
                                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpConstantNullTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpConstantCompositeTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createMemoryAccessTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpUndefTests((TestContext *)
                               instructionTests.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createSelectionBlockOrderTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createModuleTests((TestContext *)
                              instructionTests.
                              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createSwitchBlockOrderTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpPhiTests((TestContext *)
                             instructionTests.
                             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                             .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createNoContractionTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpQuantizeTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createLoopTests((TestContext *)
                            instructionTests.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createSpecConstantTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &anon_unknown_5::createSpecConstantOpQuantizeToF16Group
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createBarrierTests((TestContext *)
                               instructionTests.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createDecorationGroupTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createFRemTests((TestContext *)
                            instructionTests.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._8_8_)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpSRemGraphicsTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &createOpSModGraphicsTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_PASS)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    instructionTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"android","Android CTS Tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_89);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_88,pTVar1
            );
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_88)->super_TestNode;
  pTVar3 = &createOpSRemGraphicsTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_QUALITY_WARNING)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_88)->super_TestNode;
  pTVar3 = &createOpSModGraphicsTests
                      ((TestContext *)
                       instructionTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_,QP_TEST_RESULT_QUALITY_WARNING)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_88
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_88);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createInstructionTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> instructionTests	(new tcu::TestCaseGroup(testCtx, "instruction", "Instructions with special opcodes/operands"));
	de::MovePtr<tcu::TestCaseGroup> computeTests		(new tcu::TestCaseGroup(testCtx, "compute", "Compute Instructions with special opcodes/operands"));
	de::MovePtr<tcu::TestCaseGroup> graphicsTests		(new tcu::TestCaseGroup(testCtx, "graphics", "Graphics Instructions with special opcodes/operands"));

	computeTests->addChild(createOpNopGroup(testCtx));
	computeTests->addChild(createOpFUnordGroup(testCtx));
	computeTests->addChild(createOpAtomicGroup(testCtx));
	computeTests->addChild(createOpLineGroup(testCtx));
	computeTests->addChild(createOpNoLineGroup(testCtx));
	computeTests->addChild(createOpConstantNullGroup(testCtx));
	computeTests->addChild(createOpConstantCompositeGroup(testCtx));
	computeTests->addChild(createOpConstantUsageGroup(testCtx));
	computeTests->addChild(createSpecConstantGroup(testCtx));
	computeTests->addChild(createOpSourceGroup(testCtx));
	computeTests->addChild(createOpSourceExtensionGroup(testCtx));
	computeTests->addChild(createDecorationGroupGroup(testCtx));
	computeTests->addChild(createOpPhiGroup(testCtx));
	computeTests->addChild(createLoopControlGroup(testCtx));
	computeTests->addChild(createFunctionControlGroup(testCtx));
	computeTests->addChild(createSelectionControlGroup(testCtx));
	computeTests->addChild(createBlockOrderGroup(testCtx));
	computeTests->addChild(createMultipleShaderGroup(testCtx));
	computeTests->addChild(createMemoryAccessGroup(testCtx));
	computeTests->addChild(createOpCopyMemoryGroup(testCtx));
	computeTests->addChild(createOpCopyObjectGroup(testCtx));
	computeTests->addChild(createNoContractionGroup(testCtx));
	computeTests->addChild(createOpUndefGroup(testCtx));
	computeTests->addChild(createOpUnreachableGroup(testCtx));
	computeTests ->addChild(createOpQuantizeToF16Group(testCtx));
	computeTests ->addChild(createOpFRemGroup(testCtx));
	computeTests->addChild(createOpSRemComputeGroup(testCtx, QP_TEST_RESULT_PASS));
	computeTests->addChild(createOpSRemComputeGroup64(testCtx, QP_TEST_RESULT_PASS));
	computeTests->addChild(createOpSModComputeGroup(testCtx, QP_TEST_RESULT_PASS));
	computeTests->addChild(createOpSModComputeGroup64(testCtx, QP_TEST_RESULT_PASS));
	computeTests->addChild(createSConvertTests(testCtx));
	computeTests->addChild(createUConvertTests(testCtx));
	computeTests->addChild(createOpCompositeInsertGroup(testCtx));
	computeTests->addChild(createOpInBoundsAccessChainGroup(testCtx));
	computeTests->addChild(createShaderDefaultOutputGroup(testCtx));

	{
		de::MovePtr<tcu::TestCaseGroup>	computeAndroidTests	(new tcu::TestCaseGroup(testCtx, "android", "Android CTS Tests"));

		computeAndroidTests->addChild(createOpSRemComputeGroup(testCtx, QP_TEST_RESULT_QUALITY_WARNING));
		computeAndroidTests->addChild(createOpSModComputeGroup(testCtx, QP_TEST_RESULT_QUALITY_WARNING));

		computeTests->addChild(computeAndroidTests.release());
	}

	graphicsTests->addChild(createOpNopTests(testCtx));
	graphicsTests->addChild(createOpSourceTests(testCtx));
	graphicsTests->addChild(createOpSourceContinuedTests(testCtx));
	graphicsTests->addChild(createOpLineTests(testCtx));
	graphicsTests->addChild(createOpNoLineTests(testCtx));
	graphicsTests->addChild(createOpConstantNullTests(testCtx));
	graphicsTests->addChild(createOpConstantCompositeTests(testCtx));
	graphicsTests->addChild(createMemoryAccessTests(testCtx));
	graphicsTests->addChild(createOpUndefTests(testCtx));
	graphicsTests->addChild(createSelectionBlockOrderTests(testCtx));
	graphicsTests->addChild(createModuleTests(testCtx));
	graphicsTests->addChild(createSwitchBlockOrderTests(testCtx));
	graphicsTests->addChild(createOpPhiTests(testCtx));
	graphicsTests->addChild(createNoContractionTests(testCtx));
	graphicsTests->addChild(createOpQuantizeTests(testCtx));
	graphicsTests->addChild(createLoopTests(testCtx));
	graphicsTests->addChild(createSpecConstantTests(testCtx));
	graphicsTests->addChild(createSpecConstantOpQuantizeToF16Group(testCtx));
	graphicsTests->addChild(createBarrierTests(testCtx));
	graphicsTests->addChild(createDecorationGroupTests(testCtx));
	graphicsTests->addChild(createFRemTests(testCtx));
	graphicsTests->addChild(createOpSRemGraphicsTests(testCtx, QP_TEST_RESULT_PASS));
	graphicsTests->addChild(createOpSModGraphicsTests(testCtx, QP_TEST_RESULT_PASS));

	{
		de::MovePtr<tcu::TestCaseGroup>	graphicsAndroidTests	(new tcu::TestCaseGroup(testCtx, "android", "Android CTS Tests"));

		graphicsAndroidTests->addChild(createOpSRemGraphicsTests(testCtx, QP_TEST_RESULT_QUALITY_WARNING));
		graphicsAndroidTests->addChild(createOpSModGraphicsTests(testCtx, QP_TEST_RESULT_QUALITY_WARNING));

		graphicsTests->addChild(graphicsAndroidTests.release());
	}

	instructionTests->addChild(computeTests.release());
	instructionTests->addChild(graphicsTests.release());

	return instructionTests.release();
}